

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O1

void __thiscall btMultiBody::setJointVelMultiDof(btMultiBody *this,int i,btScalar *qdot)

{
  int iVar1;
  btMultibodyLink *pbVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  
  pbVar2 = (this->m_links).m_data;
  lVar4 = (long)pbVar2[i].m_dofCount;
  if (0 < lVar4) {
    iVar1 = pbVar2[i].m_dofOffset;
    pfVar3 = (this->m_realBuf).m_data;
    lVar5 = 0;
    do {
      pfVar3[iVar1 + 6 + (int)lVar5] = qdot[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return;
}

Assistant:

void btMultiBody::setJointVelMultiDof(int i, btScalar *qdot)
{
	for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		m_realBuf[6 + m_links[i].m_dofOffset + dof] = qdot[dof];
}